

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_test.cc
# Opt level: O2

string * __thiscall
leveldb::Harness::PickRandomKey
          (string *__return_storage_ptr__,Harness *this,Random *rnd,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *keys)

{
  char cVar1;
  pointer pbVar2;
  pointer pbVar3;
  size_type sVar4;
  pointer pcVar5;
  Comparator *pCVar6;
  uint32_t uVar7;
  Comparator *pCVar8;
  Slice *key;
  Slice *key_00;
  pointer local_78;
  size_type sStack_70;
  string local_68;
  string rev;
  
  pbVar2 = (keys->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar3 = (keys->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar2 == pbVar3) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"foo",(allocator *)&rev);
  }
  else {
    uVar7 = Random::Next(rnd);
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,
               (string *)
               ((keys->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start +
               (int)((ulong)uVar7 % ((ulong)((long)pbVar3 - (long)pbVar2) >> 5 & 0xffffffff))));
    uVar7 = Random::Next(rnd);
    if (uVar7 % 3 == 2) {
      pCVar6 = (this->options_).comparator;
      pCVar8 = BytewiseComparator();
      if (pCVar8 == pCVar6) {
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      else {
        if (pCVar6 != (Comparator *)&reverse_key_comparator) {
          __assert_fail("cmp == &reverse_key_comparator",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/table/table_test.cc"
                        ,0x46,"void leveldb::Increment(const Comparator *, std::string *)");
        }
        local_68._M_dataplus._M_p = (__return_storage_ptr__->_M_dataplus)._M_p;
        local_68._M_string_length = __return_storage_ptr__->_M_string_length;
        Reverse_abi_cxx11_(&rev,(leveldb *)&local_68,key);
        std::__cxx11::string::push_back((char)&rev);
        local_78 = rev._M_dataplus._M_p;
        sStack_70 = rev._M_string_length;
        Reverse_abi_cxx11_(&local_68,(leveldb *)&local_78,key_00);
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_68);
        std::__cxx11::string::_M_dispose();
        std::__cxx11::string::_M_dispose();
      }
    }
    else if ((uVar7 % 3 == 1) && (sVar4 = __return_storage_ptr__->_M_string_length, sVar4 != 0)) {
      pcVar5 = (__return_storage_ptr__->_M_dataplus)._M_p;
      cVar1 = pcVar5[sVar4 - 1];
      if ('\0' < cVar1) {
        pcVar5[sVar4 - 1] = cVar1 + -1;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string PickRandomKey(Random* rnd, const std::vector<std::string>& keys) {
    if (keys.empty()) {
      return "foo";
    } else {
      const int index = rnd->Uniform(keys.size());
      std::string result = keys[index];
      switch (rnd->Uniform(3)) {
        case 0:
          // Return an existing key
          break;
        case 1: {
          // Attempt to return something smaller than an existing key
          if (!result.empty() && result[result.size() - 1] > '\0') {
            result[result.size() - 1]--;
          }
          break;
        }
        case 2: {
          // Return something larger than an existing key
          Increment(options_.comparator, &result);
          break;
        }
      }
      return result;
    }
  }